

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[9],int&,char_const(&)[3],char*,char_const(&)[12]>
          (String *__return_storage_ptr__,kj *this,char (*params) [9],int *params_1,
          char (*params_2) [3],char **params_3,char (*params_4) [12])

{
  char (*value) [9];
  kj *this_00;
  char (*value_00) [3];
  char **value_01;
  char (*value_02) [12];
  int *value_03;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  CappedArray<char,_14UL> local_60;
  ArrayPtr<const_char> local_48;
  char (*local_38) [12];
  char (*params_local_4) [12];
  char **params_local_3;
  char (*params_local_2) [3];
  int *params_local_1;
  char (*params_local) [9];
  
  local_38 = (char (*) [12])params_3;
  params_local_4 = (char (*) [12])params_2;
  params_local_3 = (char **)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (int *)this;
  params_local = (char (*) [9])__return_storage_ptr__;
  value = ::const((char (*) [9])this);
  local_48 = toCharSequence<char_const(&)[9]>(value);
  this_00 = (kj *)fwd<int&>((int *)params_local_2);
  toCharSequence<int&>(&local_60,this_00,value_03);
  value_00 = ::const((char (*) [3])params_local_3);
  local_70 = toCharSequence<char_const(&)[3]>(value_00);
  value_01 = fwd<char*>((NoInfer<char_*> *)params_local_4);
  local_80 = toCharSequence<char*>(value_01);
  value_02 = ::const(local_38);
  local_90 = toCharSequence<char_const(&)[12]>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_14UL> *)&local_70,&local_80,&local_90,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}